

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_state_machine.hpp
# Opt level: O2

bool __thiscall duckdb::CSVStates::EmptyLastValue(CSVStates *this)

{
  byte bVar1;
  
  if (this->states[0] == STANDARD) {
    bVar1 = this->states[1] == DELIMITER;
  }
  else if ((this->states[0] == DELIMITER) && (this->states[1] < QUOTED)) {
    bVar1 = 0x62 >> (this->states[1] & (UNQUOTED_ESCAPE|STANDARD_NEWLINE));
  }
  else {
    bVar1 = 0;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

inline bool EmptyLastValue() const {
		// It is a new row, if the previous state is not a record separator, and the current one is
		return (states[0] == CSVState::DELIMITER &&
		        (states[1] == CSVState::RECORD_SEPARATOR || states[1] == CSVState::CARRIAGE_RETURN ||
		         states[1] == CSVState::DELIMITER)) ||
		       (states[0] == CSVState::STANDARD && states[1] == CSVState::DELIMITER);
	}